

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure_test.cc
# Opt level: O1

void __thiscall
xLearn::DMATRIX_TEST_Find_Max_Feat_and_Field_Test::TestBody
          (DMATRIX_TEST_Find_Max_Feat_and_Field_Test *this)

{
  pointer pNVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 uVar4;
  byte bVar5;
  byte bVar6;
  bool bVar7;
  ulong uVar8;
  index_t row_id;
  size_t i;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  pointer pNVar12;
  char *pcVar13;
  ushort uVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined4 uVar24;
  AssertionResult gtest_ar;
  DMatrix matrix;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  AssertHelper local_a0;
  internal local_98 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  undefined1 local_88 [48];
  pointer pfStack_58;
  undefined1 auStack_50 [16];
  pointer pfStack_40;
  pointer pfStack_38;
  unkbyte9 Stack_30;
  index_t local_24;
  
  local_24 = 0;
  local_88._0_8_ = 0;
  local_88._8_8_ = 0;
  local_88._16_4_ = 0;
  local_88._33_15_ = SUB6415(ZEXT464(0),0) << 0x40;
  local_88._24_8_ = (pointer)0x0;
  local_88[0x20] = 0;
  pfStack_58 = (pointer)0x0;
  auStack_50 = (undefined1  [16])0x0;
  pfStack_40 = (pointer)0x0;
  pfStack_38 = (pointer)0x0;
  Stack_30._0_8_ = (pointer)0x0;
  Stack_30._8_1_ = false;
  DMatrix::Reset((DMatrix *)local_88);
  lVar9 = 0;
  do {
    DMatrix::AddRow((DMatrix *)local_88);
    row_id = (index_t)lVar9;
    DMatrix::AddNode((DMatrix *)local_88,row_id,row_id,2.5,row_id);
    pfStack_58[lVar9] = (float)lVar9;
    pfStack_40[lVar9] = 0.25;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 10);
  local_88._0_8_ = 0x4d2;
  local_88._8_8_ = &DAT_0000162e;
  uVar24 = 0;
  if ((ulong)(uint)local_88._16_4_ != 0) {
    auVar16 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    vpmovzxbd_avx512f(_DAT_00147030);
    uVar10 = 0;
    do {
      pNVar12 = ((*(pointer)(local_88._24_8_ + uVar10 * 8))->
                super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pNVar1 = ((*(pointer)(local_88._24_8_ + uVar10 * 8))->
               super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (pNVar12 != pNVar1) {
        auVar18 = vpbroadcastq_avx512f();
        uVar8 = (ulong)((long)pNVar1 + (-0xc - (long)pNVar12)) / 0xc + 0x10 & 0x3ffffffffffffff0;
        auVar19 = vpbroadcastd_avx512f();
        auVar18 = vpsrlq_avx512f(auVar18,3);
        uVar11 = 0;
        do {
          auVar20 = vmovdqa64_avx512f(auVar19);
          auVar19 = vpbroadcastq_avx512f();
          auVar21 = vporq_avx512f(auVar19,auVar16);
          auVar19 = vporq_avx512f(auVar19,auVar17);
          uVar4 = vpcmpuq_avx512f(auVar19,auVar18,2);
          bVar5 = (byte)uVar4;
          uVar4 = vpcmpuq_avx512f(auVar21,auVar18,2);
          bVar6 = (byte)uVar4;
          uVar14 = CONCAT11(bVar6,bVar5);
          auVar19 = vpgatherdd_avx512f(*(undefined4 *)((long)&pNVar12->feat_id + uVar8));
          auVar21._4_4_ = (uint)((byte)(uVar14 >> 1) & 1) * auVar19._4_4_;
          auVar21._0_4_ = (uint)(bVar5 & 1) * auVar19._0_4_;
          auVar21._8_4_ = (uint)((byte)(uVar14 >> 2) & 1) * auVar19._8_4_;
          auVar21._12_4_ = (uint)((byte)(uVar14 >> 3) & 1) * auVar19._12_4_;
          auVar21._16_4_ = (uint)((byte)(uVar14 >> 4) & 1) * auVar19._16_4_;
          auVar21._20_4_ = (uint)((byte)(uVar14 >> 5) & 1) * auVar19._20_4_;
          auVar21._24_4_ = (uint)((byte)(uVar14 >> 6) & 1) * auVar19._24_4_;
          auVar21._28_4_ = (uint)((byte)(uVar14 >> 7) & 1) * auVar19._28_4_;
          auVar21._32_4_ = (uint)(bVar6 & 1) * auVar19._32_4_;
          auVar21._36_4_ = (uint)(bVar6 >> 1 & 1) * auVar19._36_4_;
          auVar21._40_4_ = (uint)(bVar6 >> 2 & 1) * auVar19._40_4_;
          auVar21._44_4_ = (uint)(bVar6 >> 3 & 1) * auVar19._44_4_;
          auVar21._48_4_ = (uint)(bVar6 >> 4 & 1) * auVar19._48_4_;
          auVar21._52_4_ = (uint)(bVar6 >> 5 & 1) * auVar19._52_4_;
          auVar21._56_4_ = (uint)(bVar6 >> 6 & 1) * auVar19._56_4_;
          auVar21._60_4_ = (uint)(bVar6 >> 7) * auVar19._60_4_;
          auVar19 = vpmaxud_avx512f(auVar21,auVar20);
          uVar11 = uVar11 + 0x10;
          pNVar12 = pNVar12 + 0x10;
        } while (uVar8 != uVar11);
        auVar18 = vmovdqa32_avx512f(auVar19);
        auVar19._0_4_ = (uint)(bVar5 & 1) * auVar18._0_4_ | (uint)!(bool)(bVar5 & 1) * auVar20._0_4_
        ;
        bVar7 = (bool)((byte)(uVar14 >> 1) & 1);
        auVar19._4_4_ = (uint)bVar7 * auVar18._4_4_ | (uint)!bVar7 * auVar20._4_4_;
        bVar7 = (bool)((byte)(uVar14 >> 2) & 1);
        auVar19._8_4_ = (uint)bVar7 * auVar18._8_4_ | (uint)!bVar7 * auVar20._8_4_;
        bVar7 = (bool)((byte)(uVar14 >> 3) & 1);
        auVar19._12_4_ = (uint)bVar7 * auVar18._12_4_ | (uint)!bVar7 * auVar20._12_4_;
        bVar7 = (bool)((byte)(uVar14 >> 4) & 1);
        auVar19._16_4_ = (uint)bVar7 * auVar18._16_4_ | (uint)!bVar7 * auVar20._16_4_;
        bVar7 = (bool)((byte)(uVar14 >> 5) & 1);
        auVar19._20_4_ = (uint)bVar7 * auVar18._20_4_ | (uint)!bVar7 * auVar20._20_4_;
        bVar7 = (bool)((byte)(uVar14 >> 6) & 1);
        auVar19._24_4_ = (uint)bVar7 * auVar18._24_4_ | (uint)!bVar7 * auVar20._24_4_;
        bVar7 = (bool)((byte)(uVar14 >> 7) & 1);
        auVar19._28_4_ = (uint)bVar7 * auVar18._28_4_ | (uint)!bVar7 * auVar20._28_4_;
        auVar19._32_4_ =
             (uint)(bVar6 & 1) * auVar18._32_4_ | (uint)!(bool)(bVar6 & 1) * auVar20._32_4_;
        bVar7 = (bool)(bVar6 >> 1 & 1);
        auVar19._36_4_ = (uint)bVar7 * auVar18._36_4_ | (uint)!bVar7 * auVar20._36_4_;
        bVar7 = (bool)(bVar6 >> 2 & 1);
        auVar19._40_4_ = (uint)bVar7 * auVar18._40_4_ | (uint)!bVar7 * auVar20._40_4_;
        bVar7 = (bool)(bVar6 >> 3 & 1);
        auVar19._44_4_ = (uint)bVar7 * auVar18._44_4_ | (uint)!bVar7 * auVar20._44_4_;
        bVar7 = (bool)(bVar6 >> 4 & 1);
        auVar19._48_4_ = (uint)bVar7 * auVar18._48_4_ | (uint)!bVar7 * auVar20._48_4_;
        bVar7 = (bool)(bVar6 >> 5 & 1);
        auVar19._52_4_ = (uint)bVar7 * auVar18._52_4_ | (uint)!bVar7 * auVar20._52_4_;
        bVar7 = (bool)(bVar6 >> 6 & 1);
        auVar19._56_4_ = (uint)bVar7 * auVar18._56_4_ | (uint)!bVar7 * auVar20._56_4_;
        auVar19._60_4_ =
             (uint)(bVar6 >> 7) * auVar18._60_4_ | (uint)!(bool)(bVar6 >> 7) * auVar20._60_4_;
        auVar15 = vextracti64x4_avx512f(auVar19,1);
        auVar18 = vpmaxud_avx512f(auVar19,ZEXT3264(auVar15));
        auVar2 = vpmaxud_avx(auVar18._0_16_,auVar18._16_16_);
        auVar3 = vpshufd_avx(auVar2,0xee);
        auVar2 = vpmaxud_avx(auVar2,auVar3);
        auVar3 = vpshufd_avx(auVar2,0x55);
        auVar2 = vpmaxud_avx(auVar2,auVar3);
        uVar24 = auVar2._0_4_;
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != (uint)local_88._16_4_);
  }
  local_a8.ptr_._0_4_ = uVar24;
  local_a0.data_._0_4_ = 9;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            (local_98,"matrix.MaxFeat()","9",(uint *)&local_a8,(int *)&local_a0);
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_a8);
    if (local_90.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = ((local_90.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
               ,0x90,pcVar13);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_a8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar7 = testing::internal::IsTrue(true);
      if ((bVar7) &&
         (local_a8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_a8.ptr_ + 8))();
      }
      local_a8.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  uVar24 = 0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if ((ulong)(uint)local_88._16_4_ != 0) {
    uVar24 = 0;
    auVar16 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    vpmovzxbd_avx512f(_DAT_00147030);
    uVar10 = 0;
    do {
      pNVar12 = ((*(pointer)(local_88._24_8_ + uVar10 * 8))->
                super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pNVar1 = ((*(pointer)(local_88._24_8_ + uVar10 * 8))->
               super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (pNVar12 != pNVar1) {
        auVar18 = vpbroadcastq_avx512f();
        uVar8 = (ulong)((long)pNVar1 + (-0xc - (long)pNVar12)) / 0xc + 0x10 & 0x3ffffffffffffff0;
        auVar19 = vpbroadcastd_avx512f();
        auVar18 = vpsrlq_avx512f(auVar18,3);
        uVar11 = 0;
        do {
          auVar20 = vmovdqa64_avx512f(auVar19);
          auVar19 = vpbroadcastq_avx512f();
          auVar21 = vporq_avx512f(auVar19,auVar16);
          auVar19 = vporq_avx512f(auVar19,auVar17);
          uVar4 = vpcmpuq_avx512f(auVar19,auVar18,2);
          bVar5 = (byte)uVar4;
          uVar4 = vpcmpuq_avx512f(auVar21,auVar18,2);
          bVar6 = (byte)uVar4;
          uVar14 = CONCAT11(bVar6,bVar5);
          auVar19 = vpgatherdd_avx512f(*(undefined4 *)((long)&pNVar12->field_id + uVar8));
          auVar22._4_4_ = (uint)((byte)(uVar14 >> 1) & 1) * auVar19._4_4_;
          auVar22._0_4_ = (uint)(bVar5 & 1) * auVar19._0_4_;
          auVar22._8_4_ = (uint)((byte)(uVar14 >> 2) & 1) * auVar19._8_4_;
          auVar22._12_4_ = (uint)((byte)(uVar14 >> 3) & 1) * auVar19._12_4_;
          auVar22._16_4_ = (uint)((byte)(uVar14 >> 4) & 1) * auVar19._16_4_;
          auVar22._20_4_ = (uint)((byte)(uVar14 >> 5) & 1) * auVar19._20_4_;
          auVar22._24_4_ = (uint)((byte)(uVar14 >> 6) & 1) * auVar19._24_4_;
          auVar22._28_4_ = (uint)((byte)(uVar14 >> 7) & 1) * auVar19._28_4_;
          auVar22._32_4_ = (uint)(bVar6 & 1) * auVar19._32_4_;
          auVar22._36_4_ = (uint)(bVar6 >> 1 & 1) * auVar19._36_4_;
          auVar22._40_4_ = (uint)(bVar6 >> 2 & 1) * auVar19._40_4_;
          auVar22._44_4_ = (uint)(bVar6 >> 3 & 1) * auVar19._44_4_;
          auVar22._48_4_ = (uint)(bVar6 >> 4 & 1) * auVar19._48_4_;
          auVar22._52_4_ = (uint)(bVar6 >> 5 & 1) * auVar19._52_4_;
          auVar22._56_4_ = (uint)(bVar6 >> 6 & 1) * auVar19._56_4_;
          auVar22._60_4_ = (uint)(bVar6 >> 7) * auVar19._60_4_;
          auVar19 = vpmaxud_avx512f(auVar22,auVar20);
          uVar11 = uVar11 + 0x10;
          pNVar12 = pNVar12 + 0x10;
        } while (uVar8 != uVar11);
        auVar18 = vmovdqa32_avx512f(auVar19);
        auVar23._0_4_ = (uint)(bVar5 & 1) * auVar18._0_4_ | (uint)!(bool)(bVar5 & 1) * auVar20._0_4_
        ;
        bVar7 = (bool)((byte)(uVar14 >> 1) & 1);
        auVar23._4_4_ = (uint)bVar7 * auVar18._4_4_ | (uint)!bVar7 * auVar20._4_4_;
        bVar7 = (bool)((byte)(uVar14 >> 2) & 1);
        auVar23._8_4_ = (uint)bVar7 * auVar18._8_4_ | (uint)!bVar7 * auVar20._8_4_;
        bVar7 = (bool)((byte)(uVar14 >> 3) & 1);
        auVar23._12_4_ = (uint)bVar7 * auVar18._12_4_ | (uint)!bVar7 * auVar20._12_4_;
        bVar7 = (bool)((byte)(uVar14 >> 4) & 1);
        auVar23._16_4_ = (uint)bVar7 * auVar18._16_4_ | (uint)!bVar7 * auVar20._16_4_;
        bVar7 = (bool)((byte)(uVar14 >> 5) & 1);
        auVar23._20_4_ = (uint)bVar7 * auVar18._20_4_ | (uint)!bVar7 * auVar20._20_4_;
        bVar7 = (bool)((byte)(uVar14 >> 6) & 1);
        auVar23._24_4_ = (uint)bVar7 * auVar18._24_4_ | (uint)!bVar7 * auVar20._24_4_;
        bVar7 = (bool)((byte)(uVar14 >> 7) & 1);
        auVar23._28_4_ = (uint)bVar7 * auVar18._28_4_ | (uint)!bVar7 * auVar20._28_4_;
        auVar23._32_4_ =
             (uint)(bVar6 & 1) * auVar18._32_4_ | (uint)!(bool)(bVar6 & 1) * auVar20._32_4_;
        bVar7 = (bool)(bVar6 >> 1 & 1);
        auVar23._36_4_ = (uint)bVar7 * auVar18._36_4_ | (uint)!bVar7 * auVar20._36_4_;
        bVar7 = (bool)(bVar6 >> 2 & 1);
        auVar23._40_4_ = (uint)bVar7 * auVar18._40_4_ | (uint)!bVar7 * auVar20._40_4_;
        bVar7 = (bool)(bVar6 >> 3 & 1);
        auVar23._44_4_ = (uint)bVar7 * auVar18._44_4_ | (uint)!bVar7 * auVar20._44_4_;
        bVar7 = (bool)(bVar6 >> 4 & 1);
        auVar23._48_4_ = (uint)bVar7 * auVar18._48_4_ | (uint)!bVar7 * auVar20._48_4_;
        bVar7 = (bool)(bVar6 >> 5 & 1);
        auVar23._52_4_ = (uint)bVar7 * auVar18._52_4_ | (uint)!bVar7 * auVar20._52_4_;
        bVar7 = (bool)(bVar6 >> 6 & 1);
        auVar23._56_4_ = (uint)bVar7 * auVar18._56_4_ | (uint)!bVar7 * auVar20._56_4_;
        auVar23._60_4_ =
             (uint)(bVar6 >> 7) * auVar18._60_4_ | (uint)!(bool)(bVar6 >> 7) * auVar20._60_4_;
        auVar15 = vextracti64x4_avx512f(auVar23,1);
        auVar18 = vpmaxud_avx512f(auVar23,ZEXT3264(auVar15));
        auVar2 = vpmaxud_avx(auVar18._0_16_,auVar18._16_16_);
        auVar3 = vpshufd_avx(auVar2,0xee);
        auVar2 = vpmaxud_avx(auVar2,auVar3);
        auVar3 = vpshufd_avx(auVar2,0x55);
        auVar2 = vpmaxud_avx(auVar2,auVar3);
        uVar24 = auVar2._0_4_;
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != (uint)local_88._16_4_);
  }
  local_a8.ptr_._0_4_ = uVar24;
  local_a0.data_._0_4_ = 9;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            (local_98,"matrix.MaxField()","9",(uint *)&local_a8,(int *)&local_a0);
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_a8);
    if (local_90.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = ((local_90.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
               ,0x91,pcVar13);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_a8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar7 = testing::internal::IsTrue(true);
      if ((bVar7) &&
         (local_a8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_a8.ptr_ + 8))();
      }
      local_a8.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  DMatrix::~DMatrix((DMatrix *)local_88);
  return;
}

Assistant:

TEST(DMATRIX_TEST, Find_Max_Feat_and_Field) {
  DMatrix matrix;
  matrix.Reset();
  for (size_t i = 0; i < kLength; ++i) {
    matrix.AddRow();
    matrix.AddNode(i, i, 2.5, i);
    matrix.Y[i] = i;
    matrix.norm[i] = 0.25;
  }
  matrix.SetHash(1234, 5678);
  EXPECT_EQ(matrix.MaxFeat(), 9);
  EXPECT_EQ(matrix.MaxField(), 9);
}